

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::CenterZoomSearchResults(BoardView *this)

{
  Point PVar1;
  element_type *peVar2;
  int iVar3;
  shared_ptr<Pin> *pp;
  pointer psVar4;
  shared_ptr<Pin> *pn;
  pointer psVar5;
  float fVar9;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if ((this->config).showPins == false) {
    (this->config).showPins = true;
  }
  if ((this->config).centerZoomSearchResults == true) {
    auVar18 = _DAT_001ec600;
    auVar15 = _DAT_001ec610;
    for (psVar5 = (this->m_pinHighlighted).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        psVar5 != (this->m_pinHighlighted).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
      PVar1 = ((psVar5->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->position;
      auVar17._8_8_ = 0;
      auVar17._0_4_ = PVar1.x;
      auVar17._4_4_ = PVar1.y;
      auVar14._8_8_ = 0;
      auVar14._0_4_ = PVar1.x;
      auVar14._4_4_ = PVar1.y;
      auVar15 = minps(auVar14,auVar15);
      auVar18 = maxps(auVar17,auVar18);
    }
    for (psVar4 = (this->m_partHighlighted).
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 != (this->m_partHighlighted).
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
      peVar2 = (psVar4->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      for (psVar5 = (peVar2->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar5 != (peVar2->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
        PVar1 = ((psVar5->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->position;
        auVar7._8_8_ = 0;
        auVar7._0_4_ = PVar1.x;
        auVar7._4_4_ = PVar1.y;
        auVar11._8_8_ = 0;
        auVar11._0_4_ = PVar1.x;
        auVar11._4_4_ = PVar1.y;
        auVar15 = minps(auVar11,auVar15);
        auVar18 = maxps(auVar7,auVar18);
      }
    }
    fVar13 = auVar15._0_4_;
    fVar16 = auVar15._4_4_;
    auVar8._4_4_ = -(uint)(fVar16 == 3.4028235e+38);
    auVar8._0_4_ = -(uint)(fVar13 == 3.4028235e+38);
    auVar8._8_4_ = -(uint)(auVar18._0_4_ == 1.1754944e-38);
    auVar8._12_4_ = -(uint)(auVar18._4_4_ == 1.1754944e-38);
    iVar3 = movmskps((int)psVar4,auVar8);
    if (iVar3 == 0) {
      auVar12._8_8_ = 0;
      auVar12._0_4_ = (this->m_board_surface).x;
      auVar12._4_4_ = (this->m_board_surface).y;
      if (this->debug == true) {
        CenterZoomSearchResults();
      }
      auVar19._0_4_ = auVar18._0_4_ - fVar13;
      auVar19._4_4_ = auVar18._4_4_ - fVar16;
      auVar19._8_4_ = auVar18._8_4_ - auVar15._8_4_;
      auVar19._12_4_ = auVar18._12_4_ - auVar15._12_4_;
      auVar18 = divps(auVar12,auVar19);
      fVar10 = (float)(~-(uint)(0.0 < auVar19._0_4_) & 0x7f7fffff |
                      auVar18._0_4_ & -(uint)(0.0 < auVar19._0_4_));
      fVar9 = (float)(~-(uint)(0.0 < auVar19._4_4_) & 0x7f7fffff |
                     auVar18._4_4_ & -(uint)(0.0 < auVar19._4_4_));
      if (fVar9 <= fVar10) {
        fVar10 = fVar9;
      }
      this->m_scale = fVar10;
      if ((fVar10 == 3.4028235e+38) && (!NAN(fVar10))) {
        this->m_scale = this->m_scale_floor;
      }
      fVar10 = this->m_scale / (this->config).partZoomScaleOutFactor;
      this->m_scale = fVar10;
      if (fVar10 < this->m_scale_floor) {
        this->m_scale = this->m_scale_floor;
      }
      fVar10 = (this->m_board_surface).x;
      fVar9 = (this->m_board_surface).y;
      fVar13 = fVar13 + auVar19._0_4_ * 0.5;
      fVar16 = fVar16 + auVar19._4_4_ * 0.5;
      this->m_dx = fVar13;
      this->m_dy = fVar16;
      IVar6 = ScreenToCoord(this,fVar10 * 0.5,fVar9 * 0.5,1.0);
      this->m_dx = (IVar6.x - fVar13) + fVar13;
      this->m_dy = (IVar6.y - fVar16) + fVar16;
      this->m_needsRedraw = true;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomSearchResults(void) {
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.showPins) config.showPins = true; // Louis Rossmann UI failure fix.

	if (!config.centerZoomSearchResults) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pp : m_pinHighlighted) {
		auto &p = pp->position;
		if (p.x < min.x) min.x = p.x;
		if (p.y < min.y) min.y = p.y;
		if (p.x > max.x) max.x = p.x;
		if (p.y > max.y) max.y = p.y;
		i++;
	}

	for (auto &pp : m_partHighlighted) {
		for (auto &pn : pp->pins) {
			auto &p = pn->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;
			i++;
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);
	// fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}